

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O3

bool __thiscall axl::io::Ssl::useCertificateFile(Ssl *this,StringRef *fileName,int fileType)

{
  SSL *ssl;
  int retCode;
  C *file;
  
  ssl = (SSL *)(this->super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).m_h;
  if (fileName->m_length == 0) {
    file = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  else {
    file = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                     (fileName);
  }
  retCode = SSL_use_certificate_file(ssl,file,fileType);
  if (retCode < 1) {
    setError(this,retCode);
  }
  return 0 < retCode;
}

Assistant:

bool
Ssl::useCertificateFile(
	const sl::StringRef& fileName,
	int fileType
) {
	ASSERT(m_h);
	int result = ::SSL_use_certificate_file(m_h, fileName.sz(), fileType);
	return complete(result);
}